

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::copyGroupElements
          (TraverseSchema *this,DOMElement *elem,XercesGroupInfo *fromGroup,XercesGroupInfo *toGroup
          ,ComplexTypeInfo *typeInfo)

{
  uint uVar1;
  XMLSize_t XVar2;
  XMLCh *text1;
  QName *pQVar3;
  ulong uVar4;
  SchemaElementDecl **ppSVar5;
  MemoryManager *pMVar6;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *pBVar7;
  XMLSize_t XVar8;
  int iVar9;
  XMLSize_t index;
  SchemaElementDecl *valueToAdopt;
  undefined4 extraout_var;
  RefVectorOf<xercesc_4_0::SchemaElementDecl> *pRVar10;
  undefined4 extraout_var_00;
  long lVar11;
  uint key3;
  ulong uVar12;
  ulong uVar13;
  XMLSize_t getAt;
  bool bVar14;
  
  if (typeInfo == (ComplexTypeInfo *)0x0) {
    key3 = 0;
  }
  else {
    key3 = typeInfo->fScopeDefined;
  }
  XVar2 = (fromGroup->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
  if (typeInfo != (ComplexTypeInfo *)0x0) {
    fromGroup->fCheckElementConsistency = false;
  }
  if (XVar2 != 0) {
    getAt = 0;
    do {
      valueToAdopt = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::elementAt
                               (&fromGroup->fElements->
                                 super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,getAt);
      if (typeInfo == (ComplexTypeInfo *)0x0) {
        if (toGroup != (XercesGroupInfo *)0x0) goto LAB_0033da93;
      }
      else {
        uVar1 = valueToAdopt->fEnclosingScope;
        if (uVar1 == 0xfffffffe) {
LAB_0033d990:
          pRVar10 = typeInfo->fElements;
          if (pRVar10 == (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
            pRVar10 = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)
                      XMemory::operator_new(0x30,typeInfo->fMemoryManager);
            pMVar6 = typeInfo->fMemoryManager;
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
                 (_func_int **)&PTR__BaseRefVectorOf_00416108;
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fAdoptedElems = false;
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount = 0;
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMaxCount = 8;
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
                 (SchemaElementDecl **)0x0;
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fMemoryManager = pMVar6
            ;
            iVar9 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,0x40);
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList =
                 (SchemaElementDecl **)CONCAT44(extraout_var_00,iVar9);
            lVar11 = 0;
            do {
              (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList[lVar11] =
                   (SchemaElementDecl *)0x0;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 8);
            (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>)._vptr_BaseRefVectorOf =
                 (_func_int **)&PTR__RefVectorOf_00416090;
            typeInfo->fElements = pRVar10;
LAB_0033da59:
            pBVar7 = &typeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
            BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar7,1);
            XVar8 = pBVar7->fCurCount;
            pBVar7->fElemList[XVar8] = valueToAdopt;
            pBVar7->fCurCount = XVar8 + 1;
          }
          else {
            uVar4 = (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
            bVar14 = uVar4 != 0;
            if (uVar4 == 0) {
LAB_0033da55:
              if (!bVar14) goto LAB_0033da59;
            }
            else {
              ppSVar5 = (pRVar10->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fElemList;
              if (*ppSVar5 != valueToAdopt) {
                uVar12 = 0;
                do {
                  uVar13 = uVar4;
                  if (uVar4 - 1 == uVar12) break;
                  uVar13 = uVar12 + 1;
                  lVar11 = uVar12 + 1;
                  uVar12 = uVar13;
                } while (ppSVar5[lVar11] != valueToAdopt);
                bVar14 = uVar13 < uVar4;
                goto LAB_0033da55;
              }
            }
          }
          bVar14 = false;
        }
        else {
          text1 = ((valueToAdopt->super_XMLElementDecl).fElementName)->fLocalPart;
          iVar9 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable
                    [0xb])();
          lVar11 = CONCAT44(extraout_var,iVar9);
          if (lVar11 == 0) {
            valueToAdopt->fEnclosingScope = key3;
            pQVar3 = (valueToAdopt->super_XMLElementDecl).fElementName;
            RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                      (this->fSchemaGrammar->fGroupElemDeclPool,pQVar3->fLocalPart,pQVar3->fURIId,
                       key3,valueToAdopt);
            valueToAdopt->fEnclosingScope = uVar1;
            bVar14 = false;
          }
          else {
            if ((valueToAdopt->fComplexTypeInfo != *(ComplexTypeInfo **)(lVar11 + 0x50)) ||
               (valueToAdopt->fDatatypeValidator != *(DatatypeValidator **)(lVar11 + 0x78))) {
              reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x43,text1,
                                (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
            }
            bVar14 = true;
          }
          if (lVar11 == 0) goto LAB_0033d990;
        }
        if (!bVar14 && toGroup != (XercesGroupInfo *)0x0) {
LAB_0033da93:
          pBVar7 = &toGroup->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
          uVar4 = pBVar7->fCurCount;
          bVar14 = uVar4 != 0;
          if (bVar14) {
            if (*pBVar7->fElemList == valueToAdopt) goto LAB_0033daf4;
            uVar12 = 0;
            do {
              uVar13 = uVar4;
              if (uVar4 - 1 == uVar12) break;
              uVar13 = uVar12 + 1;
              lVar11 = uVar12 + 1;
              uVar12 = uVar13;
            } while (pBVar7->fElemList[lVar11] != valueToAdopt);
            bVar14 = uVar13 < uVar4;
          }
          if (!bVar14) {
            BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar7,1);
            XVar8 = pBVar7->fCurCount;
            pBVar7->fElemList[XVar8] = valueToAdopt;
            pBVar7->fCurCount = XVar8 + 1;
          }
        }
      }
LAB_0033daf4:
      getAt = getAt + 1;
    } while (getAt != XVar2);
  }
  return;
}

Assistant:

void TraverseSchema::copyGroupElements(const DOMElement* const elem,
                                       XercesGroupInfo* const fromGroup,
                                       XercesGroupInfo* const toGroup,
                                       ComplexTypeInfo* const typeInfo) {

    XMLSize_t elemCount = fromGroup->elementCount();
    int newScope = (typeInfo) ? typeInfo->getScopeDefined() : 0;

    if (typeInfo)
        fromGroup->setCheckElementConsistency(false);

    for (XMLSize_t i = 0; i < elemCount; i++) {

        SchemaElementDecl*       elemDecl = fromGroup->elementAt(i);

        if (typeInfo) {

            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                int                      elemURI = elemDecl->getURI();
                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                        fSchemaGrammar->getElemDecl(elemURI, localPart, 0, newScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                       reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }

                elemDecl->setEnclosingScope(newScope);
                fSchemaGrammar->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            typeInfo->addElement(elemDecl);
        }

        if (toGroup) {
            toGroup->addElement(elemDecl);
        }
    }
}